

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O0

DdManager * Llb_DriverLastPartition(Aig_Man_t *p,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  uint numVars;
  int iVar1;
  DdManager *unique;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar2;
  Aig_Obj_t *pObj_01;
  DdNode *n;
  int local_64;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bTemp;
  DdNode *bRes;
  DdNode *bProd;
  DdNode *bVar2;
  DdNode *bVar1;
  DdManager *dd;
  abctime TimeTarget_local;
  Vec_Int_t *vVarsNs_local;
  Aig_Man_t *p_local;
  
  numVars = Aig_ManObjNumMax(p);
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  bTemp = Cudd_ReadOne(unique);
  Cudd_Ref(bTemp);
  local_64 = 0;
  do {
    iVar1 = Vec_IntSize(vVarsNs);
    if (iVar1 <= local_64) {
      Cudd_AutodynDisable(unique);
      unique->bFunc = bTemp;
      unique->TimeStop = 0;
      return unique;
    }
    iVar1 = Vec_IntEntry(vVarsNs,local_64);
    pObj_00 = Aig_ManObj(p,iVar1);
    iVar1 = Saig_ObjIsLi(p,pObj_00);
    if (iVar1 != 0) {
      iVar1 = Aig_ObjId(pObj_00);
      pDVar2 = Cudd_bddIthVar(unique,iVar1);
      iVar1 = Aig_ObjFaninId0(pObj_00);
      bProd = Cudd_bddIthVar(unique,iVar1);
      pObj_01 = Aig_ObjFanin0(pObj_00);
      iVar1 = Aig_ObjIsConst1(pObj_01);
      if (iVar1 != 0) {
        bProd = Cudd_ReadOne(unique);
      }
      iVar1 = Aig_ObjFaninC0(pObj_00);
      pDVar2 = Cudd_bddXnor(unique,pDVar2,(DdNode *)((ulong)bProd ^ (long)iVar1));
      Cudd_Ref(pDVar2);
      n = Cudd_bddAnd(unique,bTemp,pDVar2);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(unique,bTemp);
        Cudd_RecursiveDeref(unique,pDVar2);
        return (DdManager *)0x0;
      }
      Cudd_Ref(n);
      Cudd_RecursiveDeref(unique,bTemp);
      Cudd_RecursiveDeref(unique,pDVar2);
      bTemp = n;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

DdManager * Llb_DriverLastPartition( Aig_Man_t * p, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
//    int fVerbose = 1;
    DdManager * dd;
    DdNode * bVar1, * bVar2, * bProd, * bRes, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;
    bRes = Cudd_ReadOne(dd);                                   Cudd_Ref( bRes );

    // mark the duplicated flop inputs
    Aig_ManForEachObjVec( vVarsNs, p, pObj, i )
    {
        if ( !Saig_ObjIsLi(p, pObj) )
            continue;
        bVar1 = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );
        bVar2 = Cudd_bddIthVar( dd, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            bVar2 = Cudd_ReadOne(dd);
        bVar2 = Cudd_NotCond( bVar2, Aig_ObjFaninC0(pObj) );
        bProd = Cudd_bddXnor( dd, bVar1, bVar2 );              Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );        Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bProd );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

/*
    Saig_ManForEachLi( p, pObj, i )
        printf( "%d ", Aig_ObjId(pObj) );
    printf( "\n" );
    Saig_ManForEachLi( p, pObj, i )
        printf( "%c%d ", Aig_ObjFaninC0(pObj)? '-':'+', Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}